

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O2

void tb(void)

{
  int iVar1;
  int iVar2;
  char buf [128];
  
  printf("SMBus / I2C tests.");
  iVar1 = i2cOpen(1,0x53,0);
  CHECK(0xb,1,iVar1,0,0,"i2cOpen");
  iVar2 = i2cWriteDevice(iVar1,"",1);
  CHECK(0xb,2,iVar2,0,0,"i2cWriteDevice");
  iVar2 = i2cReadDevice(iVar1,buf,1);
  CHECK(0xb,3,iVar2,1,0,"i2cReadDevice");
  CHECK(0xb,4,(int)buf[0],0xe5,0,"i2cReadDevice");
  iVar2 = i2cReadByte(iVar1);
  CHECK(0xb,5,iVar2,0xe5,0,"i2cReadByte");
  iVar2 = i2cReadByteData(iVar1,0);
  CHECK(0xb,6,iVar2,0xe5,0,"i2cReadByteData");
  iVar2 = i2cReadByteData(iVar1,0x30);
  CHECK(0xb,7,iVar2,2,0,"i2cReadByteData");
  iVar2 = i2cWriteDevice(iVar1,"\x1d[aBcDeFgHjKM]",0xe);
  CHECK(0xb,8,iVar2,0,0,"i2cWriteDevice");
  i2cWriteDevice(iVar1,"\x1d",1);
  iVar2 = i2cReadDevice(iVar1,buf,0xd);
  CHECK(0xb,9,iVar2,0xd,0,"i2cReadDevice");
  iVar2 = strncmp(buf,"[aBcDeFgHjKM]",0xd);
  CHECK(0xb,10,iVar2,0,0,"i2cReadDevice");
  iVar2 = bcmp(buf,"[aBcDeFgHjKM]",0xd);
  if (iVar2 != 0) {
    printf("got [%.*s] expected [%.*s]\n",0xd,buf);
  }
  iVar2 = i2cWriteByteData(iVar1,0x1d,0xaa);
  CHECK(0xb,0xb,iVar2,0,0,"i2cWriteByteData");
  iVar2 = i2cReadByteData(iVar1,0x1d);
  CHECK(0xb,0xc,iVar2,0xaa,0,"i2cReadByteData");
  iVar2 = i2cWriteByteData(iVar1,0x1d,0x55);
  CHECK(0xb,0xd,iVar2,0,0,"i2cWriteByteData");
  iVar2 = i2cReadByteData(iVar1,0x1d);
  CHECK(0xb,0xe,iVar2,0x55,0,"i2cReadByteData");
  iVar2 = i2cWriteBlockData(iVar1,0x1c,"[1234567890#]");
  CHECK(0xb,0xf,iVar2,0,0,"i2c writeBlockData");
  i2cWriteDevice(iVar1,"\x1d",1);
  iVar2 = i2cReadDevice(iVar1,buf,0xd);
  CHECK(0xb,0x10,iVar2,0xd,0,"i2cReadDevice");
  iVar2 = strncmp(buf,"[1234567890#]",0xd);
  CHECK(0xb,0x11,iVar2,0,0,"i2cReadDevice");
  iVar2 = bcmp(buf,"[1234567890#]",0xd);
  if (iVar2 != 0) {
    printf("got [%.*s] expected [%.*s]\n",0xd,buf);
  }
  iVar2 = i2cReadI2CBlockData(iVar1,0x1d,buf,0xd);
  CHECK(0xb,0x12,iVar2,0xd,0,"i2cReadI2CBlockData");
  iVar2 = strncmp(buf,"[1234567890#]",0xd);
  CHECK(0xb,0x13,iVar2,0,0,"i2cReadI2CBlockData");
  iVar2 = bcmp(buf,"[1234567890#]",0xd);
  if (iVar2 != 0) {
    printf("got [%.*s] expected [%.*s]\n",0xd,buf);
  }
  iVar2 = i2cWriteI2CBlockData(iVar1,0x1d,"(-+=;:,<>!%)");
  CHECK(0xb,0x14,iVar2,0,0,"i2cWriteI2CBlockData");
  iVar2 = i2cReadI2CBlockData(iVar1,0x1d,buf,0xc);
  CHECK(0xb,0x15,iVar2,0xc,0,"i2cReadI2CBlockData");
  iVar2 = strncmp(buf,"(-+=;:,<>!%)",0xc);
  CHECK(0xb,0x16,iVar2,0,0,"i2cReadI2CBlockData");
  iVar2 = bcmp(buf,"(-+=;:,<>!%)",0xc);
  if (iVar2 != 0) {
    printf("got [%.*s] expected [%.*s]\n",0xc,buf);
  }
  iVar1 = i2cClose(iVar1);
  CHECK(0xb,0x17,iVar1,0,0,"i2cClose");
  return;
}

Assistant:

void tb()
{
   int h, e, b, len;
   char *exp;
   char buf[128];

   printf("SMBus / I2C tests.");

   /* this test requires an ADXL345 on I2C bus 1 addr 0x53 */

   h = i2cOpen(1, 0x53, 0);
   CHECK(11, 1, h, 0, 0, "i2cOpen");

   e = i2cWriteDevice(h, "\x00", 1); /* move to known register */
   CHECK(11, 2, e, 0, 0, "i2cWriteDevice");

   b = i2cReadDevice(h, buf, 1);
   CHECK(11, 3, b, 1, 0, "i2cReadDevice");
   CHECK(11, 4, buf[0], 0xE5, 0, "i2cReadDevice");

   b = i2cReadByte(h);
   CHECK(11, 5, b, 0xE5, 0, "i2cReadByte");

   b = i2cReadByteData(h, 0);
   CHECK(11, 6, b, 0xE5, 0, "i2cReadByteData");

   b = i2cReadByteData(h, 48);
   CHECK(11, 7, b, 2, 0, "i2cReadByteData");

   exp = "\x1D[aBcDeFgHjKM]";
   len = strlen(exp);

   e = i2cWriteDevice(h, exp, len);
   CHECK(11, 8, e, 0, 0, "i2cWriteDevice");

   e = i2cWriteDevice(h, "\x1D", 1);
   b = i2cReadDevice(h, buf, len-1);
   CHECK(11, 9, b, len-1, 0, "i2cReadDevice");
   CHECK(11, 10, strncmp(buf, exp+1, len-1), 0, 0, "i2cReadDevice");

   if (strncmp(buf, exp+1, len-1))
      printf("got [%.*s] expected [%.*s]\n", len-1, buf, len-1, exp+1);

   e = i2cWriteByteData(h, 0x1d, 0xAA);
   CHECK(11, 11, e, 0, 0, "i2cWriteByteData");

   b = i2cReadByteData(h, 0x1d);
   CHECK(11, 12, b, 0xAA, 0, "i2cReadByteData");

   e = i2cWriteByteData(h, 0x1d, 0x55);
   CHECK(11, 13, e, 0, 0, "i2cWriteByteData");

   b = i2cReadByteData(h, 0x1d);
   CHECK(11, 14, b, 0x55, 0, "i2cReadByteData");

   exp = "[1234567890#]";
   len = strlen(exp);

   e = i2cWriteBlockData(h, 0x1C, exp, len);
   CHECK(11, 15, e, 0, 0, "i2c writeBlockData");

   e = i2cWriteDevice(h, "\x1D", 1);
   b = i2cReadDevice(h, buf, len);
   CHECK(11, 16, b, len, 0, "i2cReadDevice");
   CHECK(11, 17, strncmp(buf, exp, len), 0, 0, "i2cReadDevice");

   if (strncmp(buf, exp, len))
      printf("got [%.*s] expected [%.*s]\n", len, buf, len, exp);

   b = i2cReadI2CBlockData(h, 0x1D, buf, len);
   CHECK(11, 18, b, len, 0, "i2cReadI2CBlockData");
   CHECK(11, 19, strncmp(buf, exp, len), 0, 0, "i2cReadI2CBlockData");

   if (strncmp(buf, exp, len))
      printf("got [%.*s] expected [%.*s]\n", len, buf, len, exp);

   exp = "(-+=;:,<>!%)";
   len = strlen(exp);

   e = i2cWriteI2CBlockData(h, 0x1D, exp, len);
   CHECK(11, 20, e, 0, 0, "i2cWriteI2CBlockData");

   b = i2cReadI2CBlockData(h, 0x1D, buf, len);
   CHECK(11, 21, b, len, 0, "i2cReadI2CBlockData");
   CHECK(11, 22, strncmp(buf, exp, len), 0, 0, "i2cReadI2CBlockData");

   if (strncmp(buf, exp, len))
      printf("got [%.*s] expected [%.*s]\n", len, buf, len, exp);

   e = i2cClose(h);
   CHECK(11, 23, e, 0, 0, "i2cClose");
}